

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O0

bool nv::ImageIO::save(char *fileName,Image *img)

{
  bool bVar1;
  undefined1 local_40 [8];
  StdOutputStream stream;
  Image *img_local;
  char *fileName_local;
  
  stream.super_StdStream._24_8_ = img;
  StdOutputStream::StdOutputStream((StdOutputStream *)local_40,fileName);
  bVar1 = StdStream::isError((StdStream *)local_40);
  if (bVar1) {
    fileName_local._7_1_ = false;
  }
  else {
    fileName_local._7_1_ = save(fileName,(Stream *)local_40,(Image *)stream.super_StdStream._24_8_);
  }
  StdOutputStream::~StdOutputStream((StdOutputStream *)local_40);
  return fileName_local._7_1_;
}

Assistant:

bool nv::ImageIO::save(const char * fileName, Image * img)
{
	nvDebugCheck(fileName != NULL);
	nvDebugCheck(img != NULL);

	StdOutputStream stream(fileName);
	if (stream.isError())
	{
		return false;
	}

	return ImageIO::save(fileName, stream, img);
}